

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O2

void fs_get_field_size(void *serializer,char *name,int name_length,int *isize,int *jsize,int *ksize,
                      int *lsize)

{
  DataFieldInfo *pDVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,name,name + name_length);
  pDVar1 = ser::Serializer::FindField((Serializer *)serializer,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  *isize = pDVar1->iSize_;
  *jsize = pDVar1->jSize_;
  *ksize = pDVar1->kSize_;
  *lsize = pDVar1->lSize_;
  return;
}

Assistant:

void fs_get_field_size(void* serializer, const char* name, int name_length,
                       int* isize, int* jsize, int* ksize, int* lsize)
{
    const DataFieldInfo& fieldinfo = reinterpret_cast<const Serializer*>(serializer)->FindField(std::string(name, name_length));
    *isize = fieldinfo.iSize();
    *jsize = fieldinfo.jSize();
    *ksize = fieldinfo.kSize();
    *lsize = fieldinfo.lSize();
}